

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

parser_error parser_parse(parser *p,char *line)

{
  char cVar1;
  _Bool _Var2;
  int iVar3;
  parser_error pVar4;
  ushort **ppuVar5;
  char *__s;
  char *pcVar6;
  char *pcVar7;
  parser_value *p_00;
  long lVar8;
  parser_value *ppVar9;
  ulong uVar10;
  char *pcVar11;
  parser_hook *ppVar12;
  uint uVar13;
  uint uVar14;
  parser_spec *ppVar15;
  char *z;
  undefined8 uStack_40;
  char *local_38;
  
  if (p == (parser *)0x0) {
    __assert_fail("p",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/parser.c"
                  ,0xda,"enum parser_error parser_parse(struct parser *, const char *)");
  }
  if (line == (char *)0x0) {
    __assert_fail("line",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/parser.c"
                  ,0xdb,"enum parser_error parser_parse(struct parser *, const char *)");
  }
  parser_freeold(p);
  p->lineno = p->lineno + 1;
  p->colno = 1;
  p->fhead = (parser_value *)0x0;
  p->ftail = (parser_value *)0x0;
  while( true ) {
    cVar1 = *line;
    if ((long)cVar1 == 0) {
      return PARSE_ERROR_NONE;
    }
    ppuVar5 = __ctype_b_loc();
    if ((*(byte *)((long)*ppuVar5 + (long)cVar1 * 2 + 1) & 0x20) == 0) break;
    line = line + 1;
  }
  if (cVar1 == '#') {
    return PARSE_ERROR_NONE;
  }
  __s = string_make(line);
  pcVar6 = strtok(__s,":");
  if (pcVar6 == (char *)0x0) {
    mem_free(__s);
    p->error = PARSE_ERROR_MISSING_FIELD;
    return PARSE_ERROR_MISSING_FIELD;
  }
  ppVar12 = (parser_hook *)&p->hooks;
  do {
    ppVar12 = ppVar12->next;
    if (ppVar12 == (parser_hook *)0x0) {
      my_strcpy(p->errmsg,pcVar6,0x400);
      p->error = PARSE_ERROR_UNDEFINED_DIRECTIVE;
      mem_free(__s);
      return PARSE_ERROR_UNDEFINED_DIRECTIVE;
    }
    iVar3 = strcmp(ppVar12->dir,pcVar6);
  } while (iVar3 != 0);
  ppVar15 = (parser_spec *)&ppVar12->fhead;
  pcVar6 = (char *)0x0;
LAB_001a4e94:
  ppVar15 = ppVar15->next;
  if (ppVar15 != (parser_spec *)0x0) {
    uVar13 = ppVar15->type;
    uVar14 = uVar13 & 0xfffffffe;
    p->colno = p->colno + 1;
    if ((uVar13 < 0xc) && ((0xf3cU >> (uVar13 & 0x1f) & 1) != 0)) {
      pcVar7 = strtok(pcVar6,":");
LAB_001a4ed6:
      if (pcVar7 == (char *)0x0) goto LAB_001a5231;
      p_00 = (parser_value *)mem_alloc(0x28);
      (p_00->spec).next = (parser_spec *)0x0;
      (p_00->spec).type = ppVar15->type;
      (p_00->spec).name = ppVar15->name;
      if (uVar14 == 0xc) {
        pcVar6 = (char *)0x0;
        goto LAB_001a4f7c;
      }
      if (uVar14 == 10) {
        z = (char *)0x0;
        uVar10 = strtoul(pcVar7,&z,0);
        (p_00->u).cval = (wchar_t)uVar10;
        if ((z == pcVar7) || (*pcVar7 == '-')) {
LAB_001a5275:
          mem_free(p_00);
          mem_free(__s);
          my_strcpy(p->errmsg,ppVar15->name,0x400);
          p->error = PARSE_ERROR_NOT_NUMBER;
          return PARSE_ERROR_NOT_NUMBER;
        }
      }
      else if (uVar14 == 2) {
        z = (char *)0x0;
        lVar8 = strtol(pcVar7,&z,0);
        (p_00->u).cval = (wchar_t)lVar8;
        if (z == pcVar7) goto LAB_001a5275;
      }
      else {
        if ((uVar13 & 0xfffffffc) != 4) {
          if (uVar14 == 8) {
            z = (char *)0x0;
            uStack_40 = 0;
            cVar1 = *pcVar7;
            pcVar7 = pcVar7 + (cVar1 == '-');
            uVar13 = 0;
            iVar3 = 1;
LAB_001a5004:
            while( true ) {
              for (; *pcVar7 == 'M'; pcVar7 = pcVar7 + 1) {
                if (uVar13 == 2) goto LAB_001a5201;
                uVar13 = 3;
                iVar3 = 4;
              }
              if (*pcVar7 != 'd') break;
              if (2 < (int)uVar13) goto LAB_001a5201;
              if (uVar13 != 2) {
                z = (char *)CONCAT44(1,z._0_4_);
              }
              pcVar7 = pcVar7 + 1;
              uVar13 = 2;
              iVar3 = 3;
            }
            uVar10 = strtoul(pcVar7,&local_38,10);
            if (local_38 == pcVar7) {
              _Var2 = contains_only_spaces(pcVar7);
              if ((!_Var2) || ((int)uVar13 < iVar3)) goto LAB_001a5201;
              uVar10 = (ulong)z & 0xffffffff;
              goto LAB_001a5170;
            }
            if ((0x7fffffff < uVar10) || (*pcVar7 == '+')) goto LAB_001a5201;
            pcVar7 = local_38;
            if (uVar13 == 0) {
              if (*local_38 == 'd') {
                uVar13 = 1;
              }
              else {
                if (*local_38 != '+') goto LAB_001a51b0;
                uVar13 = 0;
                iVar3 = 3;
                pcVar7 = local_38 + 1;
              }
            }
            else if (uVar13 == 4) goto LAB_001a5201;
            *(int *)((long)&z + (ulong)uVar13 * 4) = (int)uVar10;
            uVar13 = uVar13 + 1;
            goto LAB_001a5004;
          }
          pcVar6 = (char *)0x0;
          goto LAB_001a4fb7;
        }
        pcVar6 = string_make(pcVar7);
        (p_00->u).sval = pcVar6;
      }
      pcVar6 = (char *)0x0;
      goto LAB_001a4fb7;
    }
    pcVar7 = strtok(pcVar6,"");
    if (uVar14 != 0xc) goto LAB_001a4ed6;
    if (pcVar7 != (char *)0x0) {
      pcVar11 = utf8_fskip(pcVar7,1,(char *)0x0);
      pcVar6 = (char *)0x0;
      if ((pcVar11 != (char *)0x0) && (pcVar6 = pcVar11, *pcVar11 != '\0')) {
        if (*pcVar11 != ':') {
          my_strcpy(p->errmsg,ppVar15->name,0x400);
          p->error = PARSE_ERROR_FIELD_TOO_LONG;
          mem_free(__s);
          return PARSE_ERROR_FIELD_TOO_LONG;
        }
        pcVar6 = pcVar11 + 1;
      }
      p_00 = (parser_value *)mem_alloc(0x28);
      (p_00->spec).next = (parser_spec *)0x0;
      (p_00->spec).type = ppVar15->type;
      (p_00->spec).name = ppVar15->name;
LAB_001a4f7c:
      text_mbstowcs(&(p_00->u).cval,pcVar7,L'\x01');
      goto LAB_001a4fb7;
    }
LAB_001a5231:
    if ((ppVar15->type & 1) == 0) {
      my_strcpy(p->errmsg,ppVar15->name,0x400);
      p->error = PARSE_ERROR_MISSING_FIELD;
      mem_free(__s);
      return PARSE_ERROR_MISSING_FIELD;
    }
  }
  mem_free(__s);
  pVar4 = (*ppVar12->func)(p);
  p->error = pVar4;
  return pVar4;
LAB_001a51b0:
  _Var2 = contains_only_spaces(local_38);
  if (!_Var2) {
LAB_001a5201:
    mem_free(p_00);
    mem_free(__s);
    my_strcpy(p->errmsg,ppVar15->name,0x400);
    p->error = PARSE_ERROR_NOT_RANDOM;
    return PARSE_ERROR_NOT_RANDOM;
  }
LAB_001a5170:
  (p_00->u).cval = (wchar_t)uVar10;
  (p_00->u).rval.dice = z._4_4_;
  (p_00->u).rval.sides = (wchar_t)uStack_40;
  (p_00->u).rval.m_bonus = uStack_40._4_4_;
  if (cVar1 == '-') {
    (p_00->u).cval = z._4_4_ * ~(wchar_t)uStack_40 - ((wchar_t)uVar10 + uStack_40._4_4_);
  }
  pcVar6 = (char *)0x0;
LAB_001a4fb7:
  ppVar9 = (parser_value *)&p->fhead;
  if (p->fhead != (parser_value *)0x0) {
    ppVar9 = p->ftail;
  }
  (ppVar9->spec).next = &p_00->spec;
  p->ftail = p_00;
  goto LAB_001a4e94;
}

Assistant:

enum parser_error parser_parse(struct parser *p, const char *line) {
	char *cline;
	char *tok;
	struct parser_hook *h;
	struct parser_spec *s;
	struct parser_value *v;
	char *sp = NULL;

	assert(p);
	assert(line);

	parser_freeold(p);

	p->lineno++;
	p->colno = 1;
	p->fhead = NULL;
	p->ftail = NULL;

	/* Ignore empty lines and comments. */
	while (*line && (isspace(*line)))
		line++;
	if (!*line || *line == '#')
		return PARSE_ERROR_NONE;

	cline = string_make(line);

	tok = strtok(cline, ":");
	if (!tok) {
		mem_free(cline);
		p->error = PARSE_ERROR_MISSING_FIELD;
		return PARSE_ERROR_MISSING_FIELD;
	}

	h = findhook(p, tok);
	if (!h) {
		my_strcpy(p->errmsg, tok, sizeof(p->errmsg));
		p->error = PARSE_ERROR_UNDEFINED_DIRECTIVE;
		mem_free(cline);
		return PARSE_ERROR_UNDEFINED_DIRECTIVE;
	}

	/* There's a little bit of trickiness here to account for optional
	 * types. The optional flag has a bit assigned to it in the spec's type
	 * tag; we compute a temporary type for the spec with that flag removed
	 * and use that instead. */
	for (s = h->fhead; s; s = s->next) {
		int t = s->type & ~PARSE_T_OPT;
		p->colno++;

		/* These types are tokenized on ':'; strings are not tokenized
		 * at all (i.e., they consume the remainder of the line) */
		if (t == PARSE_T_INT || t == PARSE_T_SYM || t == PARSE_T_RAND ||
			t == PARSE_T_UINT) {
			tok = strtok(sp, ":");
			sp = NULL;
		} else if (t == PARSE_T_CHAR) {
			tok = strtok(sp, "");
			if (tok) {
				sp = utf8_fskip(tok, 1, NULL);
				if (sp) {
					if (*sp == ':') {
						++sp;
					} else if (*sp) {
						my_strcpy(p->errmsg, s->name,
							sizeof(p->errmsg));
						p->error = PARSE_ERROR_FIELD_TOO_LONG;
						mem_free(cline);
						return PARSE_ERROR_FIELD_TOO_LONG;
					}
				}
			}
		} else {
			tok = strtok(sp, "");
			sp = NULL;
		}
		if (!tok) {
			if (!(s->type & PARSE_T_OPT)) {
				my_strcpy(p->errmsg, s->name, sizeof(p->errmsg));
				p->error = PARSE_ERROR_MISSING_FIELD;
				mem_free(cline);
				return PARSE_ERROR_MISSING_FIELD;
			}
			break;
		}

		/* Allocate a value node. */
		v = mem_alloc(sizeof *v);
		v->spec.next = NULL;
		v->spec.type = s->type;
		v->spec.name = s->name;

		/* Parse out its value. */
		if (t == PARSE_T_INT) {
			char *z = NULL;
			v->u.ival = strtol(tok, &z, 0);
			if (z == tok) {
				mem_free(v);
				mem_free(cline);
				my_strcpy(p->errmsg, s->name, sizeof(p->errmsg));
				p->error = PARSE_ERROR_NOT_NUMBER;
				return PARSE_ERROR_NOT_NUMBER;
			}
		} else if (t == PARSE_T_UINT) {
			char *z = NULL;
			v->u.uval = strtoul(tok, &z, 0);
			if (z == tok || *tok == '-') {
				mem_free(v);
				mem_free(cline);
				my_strcpy(p->errmsg, s->name, sizeof(p->errmsg));
				p->error = PARSE_ERROR_NOT_NUMBER;
				return PARSE_ERROR_NOT_NUMBER;
			}
		} else if (t == PARSE_T_CHAR) {
			text_mbstowcs(&v->u.cval, tok, 1);
		} else if (t == PARSE_T_SYM || t == PARSE_T_STR) {
			v->u.sval = string_make(tok);
		} else if (t == PARSE_T_RAND) {
			if (!parse_random(tok, &v->u.rval)) {
				mem_free(v);
				mem_free(cline);
				my_strcpy(p->errmsg, s->name, sizeof(p->errmsg));
				p->error = PARSE_ERROR_NOT_RANDOM;
				return PARSE_ERROR_NOT_RANDOM;
			}
		}

		/* Link it into the value list. */
		if (!p->fhead)
			p->fhead = v;
		else
			p->ftail->spec.next = &v->spec;
		p->ftail = v;
	}

	mem_free(cline);

	p->error = h->func(p);
	return p->error;
}